

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

Vec_Wec_t * Gia_MiniAigSuperGates(Mini_Aig_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Wec_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *vRes_00;
  int local_28;
  int iFan0;
  int Index;
  int i;
  Vec_Int_t *vMap;
  Vec_Wec_t *vRes;
  Mini_Aig_t *p_local;
  
  iVar1 = Mini_AigPoNum(p);
  p_00 = Vec_WecStart(iVar1);
  iVar1 = Mini_AigNodeNum(p);
  p_01 = Vec_IntStartFull(iVar1);
  local_28 = 0;
  for (iFan0 = 1; iVar1 = Mini_AigNodeNum(p), iFan0 < iVar1; iFan0 = iFan0 + 1) {
    iVar1 = Mini_AigNodeIsPi(p,iFan0);
    if (iVar1 != 0) {
      Vec_IntWriteEntry(p_01,iFan0,local_28);
      local_28 = local_28 + 1;
    }
  }
  iVar1 = Mini_AigPiNum(p);
  if (local_28 != iVar1) {
    __assert_fail("Index == Mini_AigPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                  ,0x342,"Vec_Wec_t *Gia_MiniAigSuperGates(Mini_Aig_t *)");
  }
  local_28 = 0;
  iFan0 = 1;
  do {
    iVar1 = Mini_AigNodeNum(p);
    if (iVar1 <= iFan0) {
      iVar1 = Mini_AigPoNum(p);
      if (local_28 != iVar1) {
        __assert_fail("Index == Mini_AigPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                      ,0x34a,"Vec_Wec_t *Gia_MiniAigSuperGates(Mini_Aig_t *)");
      }
      Vec_IntFree(p_01);
      return p_00;
    }
    iVar1 = Mini_AigNodeIsPo(p,iFan0);
    if (iVar1 != 0) {
      iVar1 = Mini_AigNodeFanin0(p,iFan0);
      iVar2 = Abc_LitIsCompl(iVar1);
      if (iVar2 != 0) {
        __assert_fail("!Abc_LitIsCompl(iFan0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                      ,0x347,"Vec_Wec_t *Gia_MiniAigSuperGates(Mini_Aig_t *)");
      }
      iVar1 = Abc_Lit2Var(iVar1);
      vRes_00 = Vec_WecEntry(p_00,local_28);
      Gia_MiniAigSuperGates_rec(p,iVar1,vRes_00,p_01);
      local_28 = local_28 + 1;
    }
    iFan0 = iFan0 + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Gia_MiniAigSuperGates( Mini_Aig_t * p )
{
    Vec_Wec_t * vRes = Vec_WecStart( Mini_AigPoNum(p) );
    Vec_Int_t * vMap = Vec_IntStartFull( Mini_AigNodeNum(p) );
    int i, Index = 0;
    Mini_AigForEachPi( p, i )
        Vec_IntWriteEntry( vMap, i, Index++ );
    assert( Index == Mini_AigPiNum(p) );
    Index = 0;
    Mini_AigForEachPo( p, i )
    {
        int iFan0 = Mini_AigNodeFanin0( p, i );
        assert( !Abc_LitIsCompl(iFan0) );
        Gia_MiniAigSuperGates_rec( p, Abc_Lit2Var(iFan0), Vec_WecEntry(vRes, Index++), vMap );
    }
    assert( Index == Mini_AigPoNum(p) );
    Vec_IntFree( vMap );
    return vRes;
}